

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf8collationiterator.cpp
# Opt level: O0

UChar __thiscall
icu_63::FCDUTF8CollationIterator::handleGetTrailSurrogate(FCDUTF8CollationIterator *this)

{
  UChar trail;
  FCDUTF8CollationIterator *this_local;
  
  if (this->state == IN_NORMALIZED) {
    this_local._6_2_ =
         UnicodeString::operator[](&this->normalized,(this->super_UTF8CollationIterator).pos);
    if ((this_local._6_2_ & 0xfc00U) == 0xdc00) {
      (this->super_UTF8CollationIterator).pos = (this->super_UTF8CollationIterator).pos + 1;
    }
  }
  else {
    this_local._6_2_ = L'\0';
  }
  return this_local._6_2_;
}

Assistant:

UChar
FCDUTF8CollationIterator::handleGetTrailSurrogate() {
    if(state != IN_NORMALIZED) { return 0; }
    U_ASSERT(pos < normalized.length());
    UChar trail;
    if(U16_IS_TRAIL(trail = normalized[pos])) { ++pos; }
    return trail;
}